

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.t.cpp
# Opt level: O1

int * __thiscall
dynamicgraph::SignalPtr<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_int>::getTime
          (SignalPtr<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *this)

{
  int iVar1;
  SignalBase<int> *pSVar2;
  undefined4 extraout_var;
  
  iVar1 = (*this->_vptr_SignalPtr[6])();
  if (((char)iVar1 != '\0') &&
     (this->signalPtr !=
      (Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *)
      ((long)&this->_vptr_SignalPtr + (long)this->_vptr_SignalPtr[-3]))) {
    pSVar2 = getAbstractPtr(this);
    iVar1 = (*pSVar2->_vptr_SignalBase[2])(pSVar2);
    return (int *)CONCAT44(extraout_var,iVar1);
  }
  return (int *)(&this->field_0x28 + (long)this->_vptr_SignalPtr[-3]);
}

Assistant:

const Time &SignalPtr<T, Time>::getTime() const {
  if ((isAbstractPluged()) && (!autoref())) {
    return getAbstractPtr()->getTime();
  }
  return Signal<T, Time>::getTime();
}